

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlers.c
# Opt level: O0

int chirc_handle(chirc_ctx_t *ctx,chirc_connection_t *conn,chirc_message_t *msg)

{
  int iVar1;
  uint local_c4;
  int local_c0;
  int i;
  int h;
  int rc;
  chirc_message_t reply;
  chirc_message_t *msg_local;
  chirc_connection_t *conn_local;
  chirc_ctx_t *ctx_local;
  
  serverlog(DEBUG,conn,"Handling command %s",msg->cmd);
  for (local_c4 = 0; local_c4 < msg->nparams; local_c4 = local_c4 + 1) {
    serverlog(DEBUG,conn,"%s[%i] = %s",msg->cmd,(ulong)(local_c4 + 1),msg->params[(int)local_c4]);
  }
  local_c0 = 0;
  while( true ) {
    if (handlers[local_c0].name == (char *)0x0) {
      return 0;
    }
    iVar1 = strcmp(msg->cmd,handlers[local_c0].name);
    if (iVar1 == 0) break;
    local_c0 = local_c0 + 1;
  }
  iVar1 = (*handlers[local_c0].func)(ctx,conn,msg);
  return iVar1;
}

Assistant:

int chirc_handle(chirc_ctx_t *ctx, chirc_connection_t *conn, chirc_message_t *msg)
{
    chirc_message_t reply;
    int rc=0, h;

    /* Print message to the server log */
    serverlog(DEBUG, conn, "Handling command %s", msg->cmd);
    for(int i=0; i<msg->nparams; i++)
        serverlog(DEBUG, conn, "%s[%i] = %s", msg->cmd, i + 1, msg->params[i]);

    /* Search the dispatch table for an entry corresponding to the
     * message we are processing */
    for(h=0; handlers[h].name != NULL; h++)
        if (!strcmp(msg->cmd, handlers[h].name))
        {

            rc = handlers[h].func(ctx, conn, msg);
            break;
        }


    return rc;
}